

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
::load(list_caster<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
       *this,handle src,bool convert)

{
  handle hVar1;
  bool bVar2;
  bool bVar3;
  long lVar4;
  sequence_iterator sVar5;
  sequence s;
  reference it;
  value_conv conv;
  handle local_98;
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  *local_90;
  handle local_88;
  handle local_80;
  PyObject *local_78;
  long local_70;
  PyObject *local_60;
  long local_58;
  object local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  
  local_90 = (vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)this;
  bVar2 = sequence::check_(src);
  if (bVar2) {
    if (src.m_ptr == (PyObject *)0x0) {
      local_98.m_ptr = (PyObject *)0x0;
    }
    else {
      if (((src.m_ptr)->ob_type->tp_flags & 0x18000000) != 0) goto LAB_0011499a;
      (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
      local_98.m_ptr = src.m_ptr;
    }
    hVar1.m_ptr = local_98.m_ptr;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::clear((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)local_90);
    if (hVar1.m_ptr != (PyObject *)0x0) {
      (hVar1.m_ptr)->ob_refcnt = (hVar1.m_ptr)->ob_refcnt + 1;
    }
    local_88.m_ptr = hVar1.m_ptr;
    reserve_maybe<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_0>
              ((list_caster<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::vector<double,_std::allocator<double>_>_>
                *)local_90,(sequence *)&local_88,
               (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)local_90);
    object::~object((object *)&local_88);
    local_78 = local_98.m_ptr;
    sVar5 = sequence::end((sequence *)&local_98);
    local_70 = sVar5.super_sequence_slow_readwrite.index;
    for (lVar4 = 0; bVar2 = local_70 == lVar4, !bVar2; lVar4 = lVar4 + 1) {
      local_60 = local_78;
      local_50.super_handle.m_ptr = (handle)(PyObject *)0x0;
      local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_58 = lVar4;
      accessor::operator_cast_to_object((accessor *)&local_80);
      bVar3 = list_caster<std::vector<double,_std::allocator<double>_>,_double>::load
                        ((list_caster<std::vector<double,_std::allocator<double>_>,_double> *)
                         &local_48,local_80,convert);
      object::~object((object *)&local_80);
      if (!bVar3) {
        std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
        object::~object(&local_50);
        break;
      }
      std::
      vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
      ::emplace_back<std::vector<double,std::allocator<double>>>
                (local_90,(vector<double,_std::allocator<double>_> *)&local_48);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
      object::~object(&local_50);
    }
    object::~object((object *)&local_98);
  }
  else {
LAB_0011499a:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<bytes>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }